

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

int dividebyN(int N)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)N;
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 0x35;
  } while (iVar2 % 0x35 == 0);
  do {
    uVar3 = uVar4;
    iVar2 = (int)uVar3;
    uVar4 = (long)iVar2 / 0x2f;
  } while (iVar2 % 0x2f == 0);
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 0x2b;
  } while (iVar2 % 0x2b == 0);
  do {
    uVar3 = uVar4;
    iVar2 = (int)uVar3;
    uVar4 = (long)iVar2 / 0x29;
  } while (iVar2 % 0x29 == 0);
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 0x25;
  } while (iVar2 % 0x25 == 0);
  do {
    uVar3 = uVar4;
    iVar2 = (int)uVar3;
    uVar4 = (long)iVar2 / 0x1f;
  } while (iVar2 % 0x1f == 0);
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 0x1d;
  } while (iVar2 % 0x1d == 0);
  do {
    uVar3 = uVar4;
    iVar2 = (int)uVar3;
    uVar4 = (long)iVar2 / 0x17;
  } while (iVar2 % 0x17 == 0);
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 0x11;
  } while (iVar2 % 0x11 == 0);
  do {
    uVar3 = uVar4;
    uVar4 = (long)(int)uVar3 / 0xd;
  } while ((int)uVar3 % 0xd == 0);
  do {
    uVar4 = uVar3 & 0xffffffff;
    iVar2 = (int)uVar3;
    uVar3 = (long)iVar2 / 0xb;
  } while (iVar2 % 0xb == 0);
  do {
    uVar3 = uVar4 & 7;
    uVar1 = uVar4;
    uVar4 = (ulong)(uint)((int)uVar4 >> 3);
  } while (uVar3 == 0);
  do {
    uVar3 = uVar1;
    iVar2 = (int)uVar3;
    uVar1 = (long)iVar2 / 7 & 0xffffffff;
  } while (iVar2 % 7 == 0);
  do {
    uVar4 = uVar3;
    iVar2 = (int)uVar4;
    uVar3 = (long)iVar2 / 5 & 0xffffffff;
  } while (iVar2 % 5 == 0);
  do {
    uVar3 = uVar4 & 3;
    uVar1 = uVar4;
    uVar4 = (ulong)(uint)((int)uVar4 >> 2);
  } while (uVar3 == 0);
  do {
    uVar3 = uVar1;
    iVar2 = (int)uVar3;
    uVar1 = (long)iVar2 / 3 & 0xffffffff;
  } while (iVar2 % 3 == 0);
  do {
    iVar2 = (int)uVar3;
    uVar4 = uVar3 & 1;
    uVar3 = (ulong)(uint)(iVar2 >> 1);
  } while (uVar4 == 0);
  return (int)(iVar2 == 1);
}

Assistant:

int dividebyN(int N) {
	while (N%53 == 0) {
		N = N/53;
	}
	while (N%47 == 0) {
		N = N/47;
	}
	while (N%43 == 0) {
		N = N/43;
	}
	while (N%41 == 0) {
		N = N/41;
	}
	while (N%37 == 0) {
		N = N/37;
	}
	while (N%31 == 0) {
		N = N/31;
	}
	while (N%29 == 0) {
		N = N/29;
	}
	while (N%23 == 0) {
		N = N/23;
	}
	while (N%17 == 0) {
		N = N/17;
	}
	while (N%13 == 0) {
		N = N/13;
	}
	while (N%11 == 0) {
		N = N/11;
	}
	while (N%8 == 0) {
		N = N/8;
	}
	while (N%7 == 0) {
		N = N/7;
	}
	while (N%5 == 0) {
		N = N/5;
	}
	while (N%4 == 0) {
		N = N/4;
	}
	while (N%3 == 0) {
		N = N/3;
	}
	while (N%2 == 0) {
		N = N/2;
	}
	if (N == 1) {
		return 1;
	}
	 return 0;

}